

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O0

void __thiscall Downloader::openDownload(Downloader *this)

{
  bool bVar1;
  QFlags<QMessageBox::StandardButton> local_74;
  QString local_70;
  QString local_58;
  QString local_30;
  QUrl local_18;
  Downloader *local_10;
  Downloader *this_local;
  
  local_10 = this;
  bVar1 = QString::isEmpty(&this->m_fileName);
  if (bVar1) {
    tr(&local_58,"Error",(char *)0x0,-1);
    tr(&local_70,"Cannot find downloaded update!",(char *)0x0,-1);
    QFlags<QMessageBox::StandardButton>::QFlags(&local_74,Close);
    QMessageBox::critical
              (&this->super_QWidget,(QString *)&local_58,(QString *)&local_70,
               (QFlags_conflict1 *)(ulong)(uint)local_74.i,NoButton);
    QString::~QString(&local_70);
    QString::~QString(&local_58);
  }
  else {
    QDir::filePath((QString *)&local_30);
    QUrl::fromLocalFile((QString *)&local_18);
    QDesktopServices::openUrl((QUrl *)&local_18);
    QUrl::~QUrl(&local_18);
    QString::~QString(&local_30);
  }
  return;
}

Assistant:

void Downloader::openDownload()
{
   if (!m_fileName.isEmpty())
      QDesktopServices::openUrl(QUrl::fromLocalFile(m_downloadDir.filePath(m_fileName)));

   else
   {
      QMessageBox::critical(this, tr("Error"), tr("Cannot find downloaded update!"), QMessageBox::Close);
   }
}